

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall
Importer_isResolvedUnitsOverTwoLevels_Test::~Importer_isResolvedUnitsOverTwoLevels_Test
          (Importer_isResolvedUnitsOverTwoLevels_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsOverTwoLevels)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/master_units.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->libraryCount());
    EXPECT_EQ(resourcePath("importer/units_definition_level_1.cellml"), importer->key(0));
    EXPECT_EQ(resourcePath("importer/units_source.cellml"), importer->key(1));

    auto units1 = model->units(0);

    EXPECT_TRUE(units1->isResolved());

    EXPECT_FALSE(model->hasUnresolvedImports());
}